

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

int tlstran_dialer_setopt(void *arg,char *name,void *buf,size_t sz,nni_type t)

{
  nng_stream_dialer *local_40;
  tlstran_ep *ep;
  int rv;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  char *name_local;
  void *arg_local;
  
  if (arg == (void *)0x0) {
    local_40 = (nng_stream_dialer *)0x0;
  }
  else {
    local_40 = *(nng_stream_dialer **)((long)arg + 0x58);
  }
  ep._0_4_ = nni_stream_dialer_set(local_40,name,buf,sz,t);
  if ((int)ep == 9) {
    ep._0_4_ = nni_setopt(tlstran_ep_options,name,arg,buf,sz,t);
  }
  return (int)ep;
}

Assistant:

static int
tlstran_dialer_setopt(
    void *arg, const char *name, const void *buf, size_t sz, nni_type t)
{
	int         rv;
	tlstran_ep *ep = arg;

	rv = nni_stream_dialer_set(
	    ep != NULL ? ep->dialer : NULL, name, buf, sz, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_setopt(tlstran_ep_options, name, ep, buf, sz, t);
	}
	return (rv);
}